

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

quat quat_slerp(quat v0,quat v1,float a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar5;
  float fVar6;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar14;
  ulong uVar13;
  float fVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  quat qVar26;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  quat local_48;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float fStack_20;
  float fStack_1c;
  float fStack_10;
  float fStack_c;
  
  fVar15 = SQRT(v0.z * v0.z + v0.y * v0.y + v0.w * v0.w + v0.x * v0.x);
  auVar22._8_4_ = in_XMM0_Dc;
  auVar22._0_8_ = v0._0_8_;
  auVar22._12_4_ = in_XMM0_Dd;
  auVar18._4_4_ = fVar15;
  auVar18._0_4_ = fVar15;
  auVar18._8_4_ = fVar15;
  auVar18._12_4_ = fVar15;
  auVar23 = divps(auVar22,auVar18);
  if ((fVar15 == 0.0) && (!NAN(fVar15))) {
    auVar23._8_4_ = in_XMM0_Dc;
    auVar23._0_8_ = v0._0_8_;
    auVar23._12_4_ = in_XMM0_Dd;
  }
  auVar24._0_8_ = v0._8_8_;
  auVar24._8_4_ = in_XMM1_Dc;
  auVar24._12_4_ = in_XMM1_Dd;
  auVar3._4_4_ = fVar15;
  auVar3._0_4_ = fVar15;
  auVar3._8_4_ = fVar15;
  auVar3._12_4_ = fVar15;
  auVar25 = divps(auVar24,auVar3);
  if ((fVar15 == 0.0) && (!NAN(fVar15))) {
    auVar25._8_4_ = in_XMM1_Dc;
    auVar25._0_8_ = auVar24._0_8_;
    auVar25._12_4_ = in_XMM1_Dd;
  }
  fVar15 = auVar23._0_4_;
  fVar19 = auVar23._4_4_;
  fVar20 = auVar25._0_4_;
  fVar21 = auVar25._4_4_;
  auVar8._0_4_ = SQRT(v1.z * v1.z + v1.y * v1.y + v1.w * v1.w + v1.x * v1.x);
  auVar8._4_4_ = auVar8._0_4_;
  auVar8._8_4_ = auVar8._0_4_;
  auVar8._12_4_ = auVar8._0_4_;
  local_48 = (quat)divps((undefined1  [16])v1,auVar8);
  if ((auVar8._0_4_ == 0.0) && (!NAN(auVar8._0_4_))) {
    local_48 = v1;
  }
  fVar6 = local_48.y;
  fVar12 = local_48.z;
  fVar14 = local_48.w;
  auVar4._4_8_ = auVar8._8_8_;
  auVar4._0_4_ = fVar6;
  auVar9._0_8_ = auVar4._0_8_ << 0x20;
  auVar9._8_4_ = fVar12;
  auVar9._12_4_ = fVar14;
  uVar13 = local_48._8_8_;
  auVar10._8_8_ = uVar13;
  auVar10._0_8_ = auVar9._8_8_;
  fVar5 = fVar21 * fVar14 + fVar20 * fVar12 + fVar15 * local_48.x + fVar19 * fVar6;
  if (ABS(fVar5) <= 0.95) {
    if (fVar5 < -fVar5) {
      local_48._0_8_ = local_48._0_8_ ^ 0x8000000080000000;
      local_48.z = -fVar12;
      local_48.w = -fVar14;
      auVar10._0_8_ = uVar13 ^ 0x8000000080000000;
      auVar10._8_4_ = -fVar12;
      auVar10._12_4_ = -fVar14;
      fVar5 = -fVar5;
    }
    if (fVar5 <= -1.0) {
      fVar5 = -1.0;
    }
    if (1.0 <= fVar5) {
      fVar5 = 1.0;
    }
    fVar5 = acosf(fVar5);
    fStack_10 = auVar23._8_4_;
    fStack_c = auVar23._12_4_;
    local_48.x = local_48.x - fVar15 * a;
    local_48.y = local_48.y - fVar19 * a;
    fStack_20 = auVar25._8_4_;
    fStack_1c = auVar25._12_4_;
    local_58 = auVar10._0_4_;
    fStack_54 = auVar10._4_4_;
    fStack_50 = auVar10._8_4_;
    fStack_4c = auVar10._12_4_;
    local_58 = local_58 - a * fVar20;
    fStack_54 = fStack_54 - a * fVar21;
    fVar6 = SQRT(local_58 * local_58 +
                 local_48.y * local_48.y + fStack_54 * fStack_54 + local_48.x * local_48.x);
    auVar17._8_4_ = local_48.z - fStack_10 * a;
    auVar17._0_8_ = CONCAT44(local_48.y,local_48.x);
    auVar17._12_4_ = local_48.w - fStack_c * a;
    auVar1._4_4_ = fVar6;
    auVar1._0_4_ = fVar6;
    auVar1._8_4_ = fVar6;
    auVar1._12_4_ = fVar6;
    auVar18 = divps(auVar17,auVar1);
    uVar16 = auVar18._0_8_;
    if ((fVar6 == 0.0) && (!NAN(fVar6))) {
      uVar16 = CONCAT44(local_48.y,local_48.x);
    }
    auVar11._4_4_ = fStack_54;
    auVar11._0_4_ = local_58;
    auVar11._8_4_ = fStack_50 - a * fStack_20;
    auVar11._12_4_ = fStack_4c - a * fStack_1c;
    auVar2._4_4_ = fVar6;
    auVar2._0_4_ = fVar6;
    auVar2._8_4_ = fVar6;
    auVar2._12_4_ = fVar6;
    auVar18 = divps(auVar11,auVar2);
    uVar7 = auVar18._0_8_;
    if ((fVar6 == 0.0) && (!NAN(fVar6))) {
      uVar7 = CONCAT44(fStack_54,local_58);
    }
    fVar6 = cosf(fVar5 * a);
    fVar5 = sinf(fVar5 * a);
    local_38 = (float)uVar16;
    fStack_34 = (float)((ulong)uVar16 >> 0x20);
    fStack_30 = (float)uVar7;
    fStack_2c = (float)((ulong)uVar7 >> 0x20);
    fVar15 = fVar5 * local_38 + fVar6 * fVar15;
    fVar19 = fVar5 * fStack_34 + fVar6 * fVar19;
    fVar20 = fVar5 * fStack_30 + fVar6 * fVar20;
    fVar21 = fVar5 * fStack_2c + fVar6 * fVar21;
  }
  else {
    fVar15 = a * (local_48.x - fVar15) + fVar15;
    fVar19 = a * (fVar6 - fVar19) + fVar19;
    fVar20 = a * (fVar12 - fVar20) + fVar20;
    fVar21 = a * (fVar14 - fVar21) + fVar21;
  }
  qVar26.y = fVar19;
  qVar26.x = fVar15;
  qVar26.w = fVar21;
  qVar26.z = fVar20;
  return qVar26;
}

Assistant:

quat quat_slerp(quat v0, quat v1, float a) {
    v0 = quat_normalize(v0);
    v1 = quat_normalize(v1);

    float dot = quat_dot(v0, v1);
    if (fabs(dot) > 0.95f) {
        return quat_add(v0, quat_scale(quat_subtract(v1, v0), a));
    }

    if (dot < 0.0f) {
        v1 = quat_scale(v1, -1.0f);
        dot = -dot;
    }

    dot = fminf(fmaxf(-1.0f, dot), 1.0f);
    float theta_0 = acosf(dot);
    float theta = theta_0 * a;

    quat v2 = quat_subtract(v1, quat_scale(v0, a));
    v2 = quat_normalize(v2);

    return quat_add(quat_scale(v0, cosf(theta)), quat_scale(v2, sinf(theta)));
}